

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlCreateMemoryParserCtxt(void)

{
  int iVar1;
  int iVar2;
  char *val;
  htmlParserCtxtPtr val_00;
  int local_2c;
  int local_28;
  int n_size;
  int size;
  int n_buffer;
  char *buffer;
  htmlParserCtxtPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_size = 0; n_size < 4; n_size = n_size + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_char_ptr(n_size,0);
      local_28 = gen_int(local_2c,1);
      if (val != (char *)0x0) {
        iVar2 = xmlStrlen(val);
        if (iVar2 < local_28) {
          local_28 = 0;
        }
      }
      val_00 = (htmlParserCtxtPtr)htmlCreateMemoryParserCtxt(val,local_28);
      desret_htmlParserCtxtPtr(val_00);
      call_tests = call_tests + 1;
      des_const_char_ptr(n_size,val,0);
      des_int(local_2c,local_28,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar2 - iVar1))
        ;
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_size);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlCreateMemoryParserCtxt(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlParserCtxtPtr ret_val;
    const char * buffer; /* a pointer to a char array */
    int n_buffer;
    int size; /* the size of the array */
    int n_size;

    for (n_buffer = 0;n_buffer < gen_nb_const_char_ptr;n_buffer++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
        mem_base = xmlMemBlocks();
        buffer = gen_const_char_ptr(n_buffer, 0);
        size = gen_int(n_size, 1);
        if ((buffer != NULL) &&
            (size > xmlStrlen(BAD_CAST buffer)))
            size = 0;

        ret_val = htmlCreateMemoryParserCtxt(buffer, size);
        desret_htmlParserCtxtPtr(ret_val);
        call_tests++;
        des_const_char_ptr(n_buffer, buffer, 0);
        des_int(n_size, size, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buffer);
            printf(" %d", n_size);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}